

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O3

void __thiscall TPZSubCompMesh::SetAnalysisNonSymSparse(TPZSubCompMesh *this,int numThreads)

{
  TPZAutoPointer<TPZLinearAnalysis> *this_00;
  TPZLinearAnalysis *pTVar1;
  TPZSubMeshAnalysis *this_01;
  TPZStructMatrix *pTVar2;
  int64_t maxeq;
  long lVar3;
  TPZMatrix<double> *pTVar4;
  TPZStepSolver<double> *this_02;
  TPZAutoPointer<TPZStructMatrix> str;
  TPZAutoPointer<TPZMatrixSolver<double>_> autostep;
  TPZAutoPointer<TPZMatrix<double>_> mat;
  TPZAutoPointer<TPZStructMatrix> local_58;
  TPZAutoPointer<TPZMatrixSolver<double>_> local_50;
  TPZAutoPointer<TPZMatrix<double>_> local_48;
  TPZAutoPointer<TPZMatrix<double>_> local_40;
  TPZAutoPointer<TPZStructMatrix> local_38;
  
  this_01 = (TPZSubMeshAnalysis *)operator_new(0x528);
  TPZSubMeshAnalysis::TPZSubMeshAnalysis(this_01,this);
  this_00 = &this->fAnalysis;
  TPZAutoPointer<TPZLinearAnalysis>::operator=(this_00,this_01);
  local_58.fRef = (TPZReference *)operator_new(0x10);
  ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_58.fRef)->fPointer = (TPZStructMatrix *)0x0;
  LOCK();
  ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  if (numThreads < 1) {
    pTVar2 = (TPZStructMatrix *)operator_new(0xb8);
    *(undefined8 *)&pTVar2->field_0xa8 = 0x1923278;
    *(undefined8 *)pTVar2 = 0x1923340;
    *(undefined4 *)(pTVar2 + 1) = 0;
    pTVar2[1].field_0x4 = 1;
    TPZStructMatrix::TPZStructMatrix
              (pTVar2,&PTR_construction_vtable_104__01922b98,&this->super_TPZCompMesh);
    *(undefined8 *)&pTVar2->field_0xa8 = 0x1922d50;
    *(undefined8 *)pTVar2 = 0x1922c70;
    TPZStructMatrixOR<double>::TPZStructMatrixOR
              ((TPZStructMatrixOR<double> *)&pTVar2->field_0xa0,
               &PTR_construction_vtable_104__01922bc0);
    *(undefined8 *)&pTVar2->field_0xa8 = 0x1922b18;
    *(undefined8 *)pTVar2 = 0x1922948;
    *(undefined8 *)&pTVar2->field_0xa0 = 0x1922a18;
    TPZAutoPointer<TPZStructMatrix>::operator=
              (&local_58,(TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)pTVar2);
  }
  else {
    pTVar2 = (TPZStructMatrix *)operator_new(0xb8);
    *(undefined8 *)&pTVar2->field_0xa8 = 0x1923278;
    *(undefined8 *)pTVar2 = 0x1923340;
    *(undefined4 *)(pTVar2 + 1) = 0;
    pTVar2[1].field_0x4 = 1;
    TPZStructMatrix::TPZStructMatrix
              (pTVar2,&PTR_construction_vtable_104__01922b98,&this->super_TPZCompMesh);
    *(undefined8 *)&pTVar2->field_0xa8 = 0x1922d50;
    *(undefined8 *)pTVar2 = 0x1922c70;
    TPZStructMatrixOR<double>::TPZStructMatrixOR
              ((TPZStructMatrixOR<double> *)&pTVar2->field_0xa0,
               &PTR_construction_vtable_104__01922bc0);
    *(undefined8 *)&pTVar2->field_0xa8 = 0x1922b18;
    *(undefined8 *)pTVar2 = 0x1922948;
    *(undefined8 *)&pTVar2->field_0xa0 = 0x1922a18;
    TPZAutoPointer<TPZStructMatrix>::operator=
              (&local_58,(TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)pTVar2);
    *(int *)((long)&(local_58.fRef)->fPointer->fMesh +
            *(long *)(*(long *)(local_58.fRef)->fPointer + -0x60)) = numThreads;
  }
  TPZCompMesh::SaddlePermute(&this->super_TPZCompMesh);
  PermuteExternalConnects(this);
  *(int *)((long)&(local_58.fRef)->fPointer->fMesh +
          *(long *)(*(long *)(local_58.fRef)->fPointer + -0x60)) = numThreads;
  maxeq = NumInternalEquations(this);
  TPZEquationFilter::SetMinMaxEq(&(local_58.fRef)->fPointer->fEquationFilter,0,maxeq);
  lVar3 = (**(code **)(*(long *)(local_58.fRef)->fPointer + 0x50))();
  if (lVar3 == 0) {
    pTVar4 = (TPZMatrix<double> *)0x0;
  }
  else {
    pTVar4 = (TPZMatrix<double> *)
             __dynamic_cast(lVar3,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  local_48.fRef = (TPZReference *)operator_new(0x10);
  ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_48.fRef)->fPointer = pTVar4;
  LOCK();
  ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  if (pTVar4 == (TPZMatrix<double> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"void TPZSubCompMesh::SetAnalysisNonSymSparse(int)",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR\n: Incompatible types. Aborting...\n",0x28);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzsubcmesh.cpp"
               ,0x526);
  }
  pTVar2 = (local_58.fRef)->fPointer;
  (pTVar2->fEquationFilter).fIsActive = false;
  TPZVec<long>::Resize(&(pTVar2->fEquationFilter).fActiveEqs,0);
  TPZVec<long>::Resize(&(pTVar2->fEquationFilter).fDestIndices,0);
  pTVar1 = this_00->fRef->fPointer;
  local_38.fRef = local_58.fRef;
  LOCK();
  ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZAnalysis::SetStructuralMatrix(&pTVar1->super_TPZAnalysis,&local_38);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&local_38);
  this_02 = (TPZStepSolver<double> *)operator_new(0x100);
  local_40.fRef = local_48.fRef;
  LOCK();
  ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(this_02,&local_40);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_40);
  TPZStepSolver<double>::SetDirect(this_02,ELDLt);
  local_50.fRef = (TPZReference *)0x0;
  local_50.fRef = (TPZReference *)operator_new(0x10);
  ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_50.fRef)->fPointer = (TPZMatrixSolver<double> *)this_02;
  LOCK();
  ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  pTVar1 = this_00->fRef->fPointer;
  (*(pTVar1->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0x10])(pTVar1,this_02);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer(&local_50);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_48);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&local_58);
  return;
}

Assistant:

void TPZSubCompMesh::SetAnalysisNonSymSparse(int numThreads)
{
    fAnalysis = new TPZSubMeshAnalysis(this);
    TPZAutoPointer<TPZStructMatrix> str = NULL;

    if(numThreads > 0){
        str = new TPZSpStructMatrix<STATE>(this);
        str->SetNumThreads(numThreads);
    }
    else{
        str = new TPZSpStructMatrix<STATE>(this);
    }

    SaddlePermute();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    PermuteExternalConnects();
    str->SetNumThreads(numThreads);
    int64_t numinternal = NumInternalEquations();
    str->EquationFilter().SetMinMaxEq(0, numinternal);
    TPZAutoPointer<TPZMatrix<STATE> > mat =
        dynamic_cast<TPZMatrix<STATE>*>(str->Create());
    if(!mat){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"ERROR\n: Incompatible types. Aborting...\n";
        DebugStop();
    }
    str->EquationFilter().Reset();
    fAnalysis->SetStructuralMatrix(str);
    TPZStepSolver<STATE> *step = new TPZStepSolver<STATE>(mat);
    step->SetDirect(ELDLt);
    TPZAutoPointer<TPZMatrixSolver<STATE> > autostep = step;
    fAnalysis->SetSolver(autostep);

}